

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O1

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::ModuleSplitter::ModuleSplitter
          (ModuleSplitter *this,Module *primary,Config *config)

{
  _func_void *p_Var1;
  size_type *psVar2;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *puVar3;
  Table **ppTVar4;
  pointer *pppEVar5;
  _Rb_tree_header *p_Var6;
  Id IVar7;
  uint uVar8;
  _Base_ptr p_Var9;
  pointer puVar10;
  _Hash_node_base *p_Var11;
  __node_base_ptr p_Var12;
  iterator __position;
  pointer ppEVar13;
  undefined8 uVar14;
  _Head_base<0UL,_wasm::Export_*,_false> _Var15;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *psVar16;
  uintptr_t uVar17;
  __buckets_ptr pp_Var18;
  _Head_base<0UL,_wasm::Function_*,_false> _Var19;
  undefined8 *puVar20;
  __node_base_ptr p_Var21;
  pointer ppEVar22;
  char *pcVar23;
  pointer puVar24;
  Global *pGVar25;
  pointer puVar26;
  DataSegment *pDVar27;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *p_Var28;
  ElementSegment *pEVar29;
  pointer puVar30;
  pointer puVar31;
  pointer puVar32;
  pointer puVar33;
  Tag *primaryItem;
  undefined1 auVar34 [16];
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  ElementSegment *pEVar38;
  Slot slot;
  void *pvVar39;
  Name table;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  Expression EVar43;
  undefined1 auVar44 [8];
  Config *pCVar45;
  char cVar46;
  char cVar47;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exportFunc;
  Module *pMVar48;
  _Rb_tree_node_base *p_Var49;
  pointer puVar50;
  size_type sVar51;
  size_t *psVar52;
  Export *pEVar53;
  mapped_type *pmVar54;
  ElementSegment *pEVar55;
  Function *pFVar56;
  Type *pTVar57;
  CallIndirect *pCVar58;
  size_type sVar59;
  undefined8 *puVar60;
  size_t sVar61;
  Type TVar62;
  undefined1 auVar63 [8];
  __node_base _Var64;
  const_iterator cVar65;
  mapped_type *pmVar66;
  mapped_type *ppFVar67;
  Function *pFVar68;
  RefNull *pRVar69;
  long *plVar70;
  RefFunc *pRVar71;
  _Hash_node_base *p_Var72;
  __node_base _Var73;
  mapped_type *pmVar74;
  Memory *secondaryItem;
  Table *pTVar75;
  Expression *pEVar76;
  undefined1 uVar77;
  long lVar78;
  _Hash_node_base *p_Var79;
  ulong uVar80;
  string_view *psVar81;
  ulong uVar82;
  variant<wasm::Name,_wasm::HeapType> *pvVar83;
  uint uVar84;
  int iVar85;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  HeapType HVar86;
  char *pcVar87;
  key_type *__k;
  __buckets_ptr pp_Var88;
  ElementSegment *pEVar89;
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  *this_00;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_2;
  pointer puVar90;
  pointer puVar91;
  pointer puVar92;
  _Base_ptr p_Var93;
  pointer puVar94;
  Config *pCVar95;
  size_t sVar96;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  _Head_base<0UL,_wasm::Table_*,_false> _Var97;
  pointer ppEVar98;
  Config *pCVar99;
  __node_base_ptr p_Var100;
  Index index;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  __node_base_ptr p_Var101;
  pointer ppEVar102;
  pointer puVar103;
  pointer puVar104;
  bool bVar105;
  string_view sVar106;
  Signature SVar107;
  IString IVar108;
  Name func;
  Name name;
  Name name_00;
  string_view s;
  string_view s_00;
  Name name_01;
  Name name_02;
  Name name_03;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  Builder local_290;
  Builder builder_2;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *functionExportNames;
  undefined1 auStack_278 [8];
  ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  segmentReferrerCollector;
  Index IStack_238;
  undefined1 auStack_198 [56];
  undefined1 local_160 [16];
  size_t local_150;
  undefined1 local_148 [16];
  _Alloc_hider local_138;
  Config *local_130;
  undefined1 auStack_128 [8];
  vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_> relevantRefFuncs;
  undefined1 auStack_108 [8];
  __single_object placeholder;
  undefined1 local_f8 [16];
  undefined1 auStack_e8 [8];
  Type params;
  undefined1 local_d8 [24];
  HeapType local_c0;
  undefined1 auStack_b8 [8];
  Builder builder_1;
  undefined1 local_a8 [16];
  Address AStack_98;
  Type local_90;
  Type local_88;
  __node_base local_80;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment_1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  segmentReferrers;
  
  this->config = config;
  local_130 = config;
  pMVar48 = (Module *)operator_new(0x3f0);
  memset(pMVar48,0,0x3f0);
  Module::Module(pMVar48);
  (this->secondaryPtr)._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
  _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl = pMVar48;
  (pMVar48->features).features = (primary->features).features;
  pMVar48->hasFeaturesSection = primary->hasFeaturesSection;
  this->primary = primary;
  this->secondary = pMVar48;
  auStack_108 = (undefined1  [8])0x0;
  placeholder._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0;
  local_f8._8_8_ =
       std::
       _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:403:16)>
       ::_M_invoke;
  local_f8._0_8_ =
       std::
       _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:403:16)>
       ::_M_manager;
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)auStack_278,primary,(Func *)auStack_108);
  local_88.id = (uintptr_t)primary;
  if ((__buckets_ptr)local_f8._0_8_ != (__buckets_ptr)0x0) {
    (*(code *)local_f8._0_8_)(auStack_108,auStack_108,3);
  }
  segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
              &segmentReferrers._M_h._M_rehash_policy._M_next_resize;
  segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x1;
  segmentReferrers._M_h._M_bucket_count = 0;
  segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  segmentReferrers._M_h._M_element_count =
       CONCAT44(segmentReferrers._M_h._M_element_count._4_4_,0x3f800000);
  segmentReferrers._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  segmentReferrers._M_h._M_rehash_policy._4_4_ = 0;
  segmentReferrers._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var49 = (_Rb_tree_node_base *)
            CONCAT44(segmentReferrerCollector._28_4_,segmentReferrerCollector._24_4_);
  if (p_Var49 != (_Rb_tree_node_base *)&segmentReferrerCollector.field_0x8) {
    do {
      p_Var9 = p_Var49[1]._M_left;
      auStack_b8 = (undefined1  [8])&segment_1;
      for (p_Var93 = p_Var49[1]._M_parent; p_Var93 != p_Var9; p_Var93 = (_Base_ptr)&p_Var93->_M_left
          ) {
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&segment_1,p_Var93,auStack_b8);
      }
      p_Var49 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var49);
    } while (p_Var49 != (_Rb_tree_node_base *)&segmentReferrerCollector.field_0x8);
  }
  pCVar99 = local_130;
  local_a8._8_8_ = &builder_1;
  builder_1.wasm = (Module *)((ulong)builder_1.wasm._4_4_ << 0x20);
  local_a8._0_8_ = (ElementSegment *)0x0;
  local_90.id = 0;
  local_d8._16_8_ = &params;
  params.id = (ulong)params.id._4_4_ << 0x20;
  local_d8._0_7_ = 0;
  local_d8._8_3_ = (undefined3)local_d8._16_8_;
  local_d8[7] = 0;
  local_d8[0xb] = (undefined1)((ulong)local_d8._16_8_ >> 0x18);
  local_d8._12_4_ = (undefined4)((ulong)local_d8._16_8_ >> 0x20);
  local_c0.id = 0;
  puVar91 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               *)(local_88.id + 0x18))->
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar10 = *(pointer *)(local_88.id + 0x20);
  AStack_98.addr = local_a8._8_8_;
  if (puVar91 != puVar10) {
    psVar16 = &local_130->secondaryFuncs;
    do {
      pFVar56 = (puVar91->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if ((*(char **)((long)&(pFVar56->super_Importable).module + 8) == (char *)0x0) &&
         (cVar65 = std::
                   _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)pCVar99,(key_type *)pFVar56),
         (_Rb_tree_header *)cVar65._M_node != &(psVar16->_M_t)._M_impl.super__Rb_tree_header)) {
        if (pCVar99->jspi == true) {
          puVar50 = *(pointer *)local_88.id;
          bVar105 = puVar50 != *(pointer *)(local_88.id + 8);
          if (bVar105) {
            bVar105 = true;
            do {
              pEVar53 = (puVar50->_M_t).
                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
              if (pEVar53->kind == Function) {
                if (*(__index_type *)
                     ((long)&(pEVar53->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10
                     ) == '\0') {
                  pvVar83 = &pEVar53->value;
                }
                else {
                  pvVar83 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
                }
                if (*(char **)((long)&(pvVar83->super__Variant_base<wasm::Name,_wasm::HeapType>).
                                      super__Move_assign_alias<wasm::Name,_wasm::HeapType> + 8) ==
                    *(char **)((long)&(((puVar91->_M_t).
                                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl
                                       )->super_Importable).super_Named + 8)) break;
              }
              puVar50 = puVar50 + 1;
              bVar105 = puVar50 != *(pointer *)(local_88.id + 8);
            } while (bVar105);
          }
          if (bVar105) goto LAB_0075152c;
        }
        sVar51 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&segment_1,
                         (key_type *)
                         (puVar91->_M_t).
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        if (sVar51 != 0) goto LAB_0075152c;
        pFVar56 = (puVar91->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        this_00 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                   *)auStack_e8;
        if (*(char **)((long)&(pFVar56->super_Importable).super_Named + 8) ==
            *(char **)(local_88.id + 200)) {
          __assert_fail("func->name != primary.start && \"The start function must be kept\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                        ,0x1ce,
                        "static std::pair<std::set<Name>, std::set<Name>> wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::classifyFunctions(Module &, const Config &)"
                       );
        }
      }
      else {
LAB_0075152c:
        pFVar56 = (puVar91->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        this_00 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                   *)auStack_b8;
      }
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>(this_00,(Name *)pFVar56);
      puVar91 = puVar91 + 1;
    } while (puVar91 != puVar10);
  }
  p_Var6 = &(this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header;
  if ((ElementSegment *)local_a8._0_8_ == (ElementSegment *)0x0) {
    (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var6->_M_header;
    (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var6->_M_header;
    psVar52 = &(this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    psVar52 = &local_90.id;
    (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (_Rb_tree_color)builder_1.wasm;
    (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_a8._0_8_;
    (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_a8._8_8_;
    (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)AStack_98.addr;
    *(_Rb_tree_header **)(local_a8._0_8_ + 8) = p_Var6;
    (this->classifiedFuncs).first._M_t._M_impl.super__Rb_tree_header._M_node_count = local_90.id;
    local_a8._0_8_ = (ElementSegment *)0x0;
    local_a8._8_8_ = &builder_1;
    AStack_98.addr = local_a8._8_8_;
  }
  *psVar52 = 0;
  p_Var6 = &(this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header;
  p_Var93 = (_Base_ptr)CONCAT17(local_d8[7],local_d8._0_7_);
  if (p_Var93 == (_Base_ptr)0x0) {
    (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var6->_M_header;
    (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var6->_M_header;
    psVar52 = &(this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    psVar52 = &local_c0.id;
    (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (_Rb_tree_color)params.id;
    (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var93;
    (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)CONCAT44(local_d8._12_4_,CONCAT13(local_d8[0xb],local_d8._8_3_));
    (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_d8._16_8_;
    p_Var93->_M_parent = &p_Var6->_M_header;
    (this->classifiedFuncs).second._M_t._M_impl.super__Rb_tree_header._M_node_count = local_c0.id;
    local_d8._0_7_ = 0;
    local_d8[7] = 0;
    local_d8._16_8_ = &params;
    local_d8._8_3_ = (undefined3)local_d8._16_8_;
    local_d8[0xb] = (undefined1)((ulong)local_d8._16_8_ >> 0x18);
    local_d8._12_4_ = (undefined4)((ulong)local_d8._16_8_ >> 0x20);
  }
  *psVar52 = 0;
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)auStack_e8);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)auStack_b8);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&segment_1);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
               *)&segmentReferrerCollector);
  TVar62.id = local_88.id;
  this->primaryFuncs = &(this->classifiedFuncs).first;
  this->secondaryFuncs = &(this->classifiedFuncs).second;
  (this->tableManager).module = (Module *)local_88.id;
  p_Var6 = &(this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->tableManager).activeTable = (Table *)0x0;
  (this->tableManager).activeSegment = (ElementSegment *)0x0;
  (this->tableManager).activeBase.tableName.super_IString.str._M_len = 0;
  (this->tableManager).activeBase.tableName.super_IString.str._M_str = (char *)0x0;
  (this->tableManager).activeBase.global.super_IString.str._M_len = 0;
  (this->tableManager).activeBase.global.super_IString.str._M_str = (char *)0x0;
  (this->tableManager).activeBase.index = 0;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var6->_M_header;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  local_148._8_8_ = &(this->tableManager).activeTableSegments;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->tableManager).activeTableSegments.
  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tableManager).activeTableSegments.
  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tableManager).activeTableSegments.
  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar106 = IString::interned((IString *)&DAT_00000019,(string_view)ZEXT816(0xdd8921),
                              SUB81(local_88.id,0));
  pEVar53 = Module::getExportOrNull((Module *)TVar62.id,(Name)sVar106);
  puVar104 = (((vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                *)(TVar62.id + 0xa8))->
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  lVar78 = (long)*(pointer *)(TVar62.id + 0xb0) - (long)puVar104;
  if (lVar78 == 8) {
    _Var97._M_head_impl =
         *(Table **)
          &(puVar104->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
           _M_t;
  }
  else {
    _Var97._M_head_impl = (Table *)0x0;
  }
  if ((((_Head_base<0UL,_wasm::Table_*,_false>)_Var97._M_head_impl ==
        (_Head_base<0UL,_wasm::Table_*,_false>)0x0) ||
      (*(char **)((long)&(_Var97._M_head_impl)->super_Importable + 0x20) == (char *)0x0)) ||
     (sVar106 = IString::interned((IString *)0x3,(string_view)ZEXT816(0xdcf2f2),SUB81(lVar78,0)),
     *(char **)((long)&(_Var97._M_head_impl)->super_Importable + 0x20) != sVar106._M_str)) {
    bVar105 = false;
  }
  else {
    sVar106 = IString::interned((IString *)&DAT_00000019,(string_view)ZEXT816(0xdd8921),
                                SUB81(lVar78,0));
    bVar105 = *(char **)((long)&(_Var97._M_head_impl)->super_Importable + 0x30) == sVar106._M_str;
  }
  local_148._0_8_ = &this->tableManager;
  if (((!bVar105) && (pEVar53 == (Export *)0x0)) &&
     ((((FunctionLocations *)(local_88.id + 0x178))->start & 0x100) != 0)) goto LAB_00751c24;
  p_Var72 = (_Hash_node_base *)
            (((vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               *)(local_88.id + 0xa8))->
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  p_Var11 = ((__node_base *)(local_88.id + 0xb0))->_M_nxt;
  lVar78 = (long)p_Var11 - (long)p_Var72 >> 5;
  p_Var79 = p_Var72;
  if (0 < lVar78) {
    p_Var79 = (_Hash_node_base *)
              ((long)&p_Var72->_M_nxt + ((long)p_Var11 - (long)p_Var72 & 0xffffffffffffffe0U));
    lVar78 = lVar78 + 1;
    p_Var72 = p_Var72 + 2;
    do {
      if (p_Var72[-2]._M_nxt[10]._M_nxt == (_Hash_node_base *)0x12) {
        p_Var72 = p_Var72 + -2;
        goto LAB_0075193f;
      }
      if (p_Var72[-1]._M_nxt[10]._M_nxt == (_Hash_node_base *)0x12) {
        p_Var72 = p_Var72 + -1;
        goto LAB_0075193f;
      }
      if (p_Var72->_M_nxt[10]._M_nxt == (_Hash_node_base *)0x12) goto LAB_0075193f;
      if (p_Var72[1]._M_nxt[10]._M_nxt == (_Hash_node_base *)0x12) {
        p_Var72 = p_Var72 + 1;
        goto LAB_0075193f;
      }
      lVar78 = lVar78 + -1;
      p_Var72 = p_Var72 + 4;
    } while (1 < lVar78);
  }
  lVar78 = (long)p_Var11 - (long)p_Var79 >> 3;
  if (lVar78 == 1) {
LAB_007518ff:
    p_Var72 = p_Var79;
    if (p_Var79->_M_nxt[10]._M_nxt != (_Hash_node_base *)0x12) {
      p_Var72 = p_Var11;
    }
  }
  else if (lVar78 == 2) {
LAB_007518f1:
    p_Var72 = p_Var79;
    if (p_Var79->_M_nxt[10]._M_nxt != (_Hash_node_base *)0x12) {
      p_Var79 = p_Var79 + 1;
      goto LAB_007518ff;
    }
  }
  else {
    p_Var72 = p_Var11;
    if ((lVar78 == 3) && (p_Var72 = p_Var79, p_Var79->_M_nxt[10]._M_nxt != (_Hash_node_base *)0x12))
    {
      p_Var79 = p_Var79 + 1;
      goto LAB_007518f1;
    }
  }
LAB_0075193f:
  if (p_Var72 == p_Var11) goto LAB_00751c24;
  ppTVar4 = &(this->tableManager).activeTable;
  pTVar75 = (Table *)p_Var72->_M_nxt;
  *ppTVar4 = pTVar75;
  pcVar87 = (pTVar75->super_Importable).super_Named.name.super_IString.str._M_str;
  if (pcVar87 == (char *)0x0) {
    __assert_fail("table.is() && \"Table name must not be null\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                  ,0x85,
                  "void wasm::ModuleUtils::iterTableSegments(Module &, Name, T) [T = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:183:32)]"
                 );
  }
  p_Var101 = (__node_base_ptr)
             (((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                *)(local_88.id + 0x60))->
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  p_Var12 = (__node_base_ptr)
            (((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
               *)(local_88.id + 0x68))->_M_h)._M_buckets;
  if (p_Var101 != p_Var12) {
    do {
      pEVar89 = (ElementSegment *)p_Var101->_M_nxt;
      if ((pEVar89->table).super_IString.str._M_str == pcVar87) {
        auStack_278._0_4_ = SUB84(pEVar89,0);
        auStack_278._4_4_ = (undefined4)((ulong)pEVar89 >> 0x20);
        __position._M_current =
             (this->tableManager).activeTableSegments.
             super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->tableManager).activeTableSegments.
            super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::ElementSegment*,std::allocator<wasm::ElementSegment*>>::
          _M_realloc_insert<wasm::ElementSegment*const&>
                    ((vector<wasm::ElementSegment*,std::allocator<wasm::ElementSegment*>> *)
                     local_148._8_8_,__position,(ElementSegment **)auStack_278);
        }
        else {
          *__position._M_current = pEVar89;
          pppEVar5 = &(this->tableManager).activeTableSegments.
                      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar5 = *pppEVar5 + 1;
        }
      }
      p_Var101 = p_Var101 + 1;
    } while (p_Var101 != p_Var12);
  }
  local_80._M_nxt = (_Hash_node_base *)&(this->tableManager).activeBase;
  ppEVar98 = (this->tableManager).activeTableSegments.
             super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar13 = (this->tableManager).activeTableSegments.
             super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar98 == ppEVar13) {
    pTVar75 = *ppTVar4;
    sVar61 = (pTVar75->super_Importable).super_Named.name.super_IString.str._M_len;
    pcVar87 = (pTVar75->super_Importable).super_Named.name.super_IString.str._M_str;
    auStack_278._0_4_ = (undefined4)sVar61;
    auStack_278._4_4_ = (undefined4)(sVar61 >> 0x20);
    segmentReferrerCollector.wasm._0_4_ = SUB84(pcVar87,0);
    segmentReferrerCollector.wasm._4_4_ = (undefined4)((ulong)pcVar87 >> 0x20);
    sVar106 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xe85cd6),
                                SUB81(local_80._M_nxt,0));
    *(undefined4 *)
     &(((Importable *)&(local_80._M_nxt)->_M_nxt)->super_Named).name.super_IString.str._M_len =
         auStack_278._0_4_;
    *(undefined4 *)
     ((long)&(((Importable *)&(local_80._M_nxt)->_M_nxt)->super_Named).name.super_IString.str._M_len
     + 4) = auStack_278._4_4_;
    *(undefined4 *)(local_80._M_nxt + 1) = segmentReferrerCollector.wasm._0_4_;
    *(undefined4 *)((long)(local_80._M_nxt + 1) + 4) = segmentReferrerCollector.wasm._4_4_;
    (this->tableManager).activeBase.global.super_IString.str = sVar106;
    (this->tableManager).activeBase.index = 0;
  }
  else {
    if (((long)ppEVar13 - (long)ppEVar98 == 8) && (pEVar89 = *ppEVar98, (pEVar89->type).id == 0x12))
    {
      IVar7 = pEVar89->offset->_id;
      if (IVar7 == GlobalGetId) {
        (this->tableManager).activeSegment = pEVar89;
        pTVar75 = (this->tableManager).activeTable;
        sVar61 = (pTVar75->super_Importable).super_Named.name.super_IString.str._M_len;
        pcVar87 = (pTVar75->super_Importable).super_Named.name.super_IString.str._M_str;
        auStack_278._0_4_ = (undefined4)sVar61;
        auStack_278._4_4_ = (undefined4)(sVar61 >> 0x20);
        segmentReferrerCollector.wasm._0_4_ = SUB84(pcVar87,0);
        segmentReferrerCollector.wasm._4_4_ = (undefined4)((ulong)pcVar87 >> 0x20);
        pEVar76 = (*ppEVar98)->offset;
        if (pEVar76->_id != GlobalGetId) {
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                        ,0x31b,"T *wasm::Expression::cast() [T = wasm::GlobalGet]");
        }
        uVar14 = *(undefined8 *)(pEVar76 + 1);
        uVar17 = pEVar76[1].type.id;
        EVar43 = pEVar76[1];
        pcVar87 = (pTVar75->super_Importable).super_Named.name.super_IString.str._M_str;
        (((Slot *)local_80._M_nxt)->tableName).super_IString.str._M_len =
             (pTVar75->super_Importable).super_Named.name.super_IString.str._M_len;
        (this->tableManager).activeBase.tableName.super_IString.str._M_str = pcVar87;
        segmentReferrerCollector._8_4_ = SUB84(uVar14,0);
        segmentReferrerCollector._12_4_ = SUB84((ulong)uVar14 >> 0x20,0);
        segmentReferrerCollector._16_4_ = SUB84(uVar17,0);
        segmentReferrerCollector._20_4_ = SUB84(uVar17 >> 0x20,0);
        *(undefined4 *)&(this->tableManager).activeBase.global.super_IString.str._M_len =
             segmentReferrerCollector._8_4_;
        *(undefined4 *)((long)&(this->tableManager).activeBase.global.super_IString.str._M_len + 4)
             = segmentReferrerCollector._12_4_;
        *(undefined4 *)&(this->tableManager).activeBase.global.super_IString.str._M_str =
             segmentReferrerCollector._16_4_;
        *(undefined4 *)((long)&(this->tableManager).activeBase.global.super_IString.str._M_str + 4)
             = segmentReferrerCollector._20_4_;
        (this->tableManager).activeBase.index = 0;
        segmentReferrerCollector._8_16_ = EVar43;
        goto LAB_00751b00;
      }
      if (IVar7 != ConstId) {
        __assert_fail("activeTableSegments[0]->offset->is<GlobalGet>() && \"Unexpected initializer instruction\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                      ,199,
                      "wasm::ModuleSplitting::(anonymous namespace)::TableSlotManager::TableSlotManager(Module &)"
                     );
      }
    }
    uVar84 = 0;
    do {
      pEVar89 = *ppEVar98;
      pEVar76 = pEVar89->offset;
      if (pEVar76->_id != ConstId) {
        __assert_fail("segment->offset->is<Const>() && \"Unexpected non-const segment offset with multiple segments\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                      ,0xd4,
                      "wasm::ModuleSplitting::(anonymous namespace)::TableSlotManager::TableSlotManager(Module &)"
                     );
      }
      if (*(long *)(pEVar76 + 2) != 2) goto LAB_00753b85;
      uVar8 = *(uint *)(pEVar76 + 1);
      lVar78 = (long)(pEVar89->data).
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pEVar89->data).
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      if ((ulong)uVar84 <= lVar78 + (ulong)uVar8) {
        (this->tableManager).activeSegment = pEVar89;
        pTVar75 = (this->tableManager).activeTable;
        sVar61 = (pTVar75->super_Importable).super_Named.name.super_IString.str._M_len;
        pcVar87 = (pTVar75->super_Importable).super_Named.name.super_IString.str._M_str;
        auStack_278._0_4_ = (undefined4)sVar61;
        auStack_278._4_4_ = (undefined4)(sVar61 >> 0x20);
        segmentReferrerCollector.wasm._0_4_ = SUB84(pcVar87,0);
        segmentReferrerCollector.wasm._4_4_ = (undefined4)((ulong)pcVar87 >> 0x20);
        sVar106 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xe85cd6),SUB81(pEVar89,0));
        uVar84 = (int)lVar78 + uVar8;
        *(undefined4 *)
         &(((Importable *)&(local_80._M_nxt)->_M_nxt)->super_Named).name.super_IString.str._M_len =
             auStack_278._0_4_;
        *(undefined4 *)
         ((long)&(((Importable *)&(local_80._M_nxt)->_M_nxt)->super_Named).name.super_IString.str.
                 _M_len + 4) = auStack_278._4_4_;
        *(undefined4 *)(local_80._M_nxt + 1) = segmentReferrerCollector.wasm._0_4_;
        *(undefined4 *)((long)(local_80._M_nxt + 1) + 4) = segmentReferrerCollector.wasm._4_4_;
        (this->tableManager).activeBase.global.super_IString.str = sVar106;
        (this->tableManager).activeBase.index = uVar8;
      }
      ppEVar98 = ppEVar98 + 1;
    } while (ppEVar98 != ppEVar13);
  }
LAB_00751b00:
  pFVar56 = (Function *)
            (((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               *)(local_88.id + 0x60))->
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_138._M_p =
       (pointer)(((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                   *)(local_88.id + 0x68))->_M_h)._M_buckets;
  if (pFVar56 != (Function *)local_138._M_p) {
    do {
      sVar61 = (pFVar56->super_Importable).super_Named.name.super_IString.str._M_len;
      local_80._M_nxt = (_Hash_node_base *)pFVar56;
      if (*(long *)(sVar61 + 0x20) != 0) {
        sVar106 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xe85cd6),SUB81(pFVar56,0));
        pcVar87 = *(char **)(sVar61 + 0x28);
        iVar85 = 0;
        if (*pcVar87 == '\n') {
          sVar106 = *(string_view *)(pcVar87 + 0x10);
        }
        else if (*pcVar87 == '\x0e') {
          if (*(long *)(pcVar87 + 0x20) != 2) goto LAB_00753b85;
          iVar85 = *(int *)(pcVar87 + 0x10);
        }
        lVar78 = *(long *)(sVar61 + 0x38);
        if (*(long *)(sVar61 + 0x40) != lVar78) {
          uVar80 = 0;
          uVar82 = 1;
          do {
            pcVar87 = *(char **)(lVar78 + uVar80 * 8);
            if (*pcVar87 == '+') {
              uVar14 = *(undefined8 *)*(undefined1 (*) [16])(sVar61 + 0x18);
              auStack_278._0_4_ = (undefined4)uVar14;
              auStack_278._4_4_ = (undefined4)((ulong)uVar14 >> 0x20);
              segmentReferrerCollector.wasm._0_4_ = (undefined4)*(undefined8 *)(sVar61 + 0x20);
              segmentReferrerCollector.wasm._4_4_ =
                   (undefined4)((ulong)*(undefined8 *)(sVar61 + 0x20) >> 0x20);
              slot._36_4_ = segmentReferrerCollector._28_4_;
              slot.index = iVar85;
              segmentReferrerCollector._8_4_ = sVar106._M_len._0_4_;
              segmentReferrerCollector._12_4_ = sVar106._M_len._4_4_;
              segmentReferrerCollector._16_4_ = sVar106._M_str._0_4_;
              segmentReferrerCollector._20_4_ = sVar106._M_str._4_4_;
              slot.global.super_IString.str._M_len._0_4_ = segmentReferrerCollector._8_4_;
              slot.tableName.super_IString.str =
                   (IString)(IString)*(undefined1 (*) [16])(sVar61 + 0x18);
              slot.global.super_IString.str._M_len._4_4_ = segmentReferrerCollector._12_4_;
              slot.global.super_IString.str._M_str._0_4_ = segmentReferrerCollector._16_4_;
              slot.global.super_IString.str._M_str._4_4_ = segmentReferrerCollector._20_4_;
              in_stack_fffffffffffffd38 = auStack_278._0_4_;
              in_stack_fffffffffffffd3c = auStack_278._4_4_;
              segmentReferrerCollector._8_16_ = sVar106;
              segmentReferrerCollector._24_4_ = iVar85;
              TableSlotManager::addSlot
                        ((TableSlotManager *)local_148._0_8_,
                         (Name)((IString *)(pcVar87 + 0x10))->str,slot);
            }
            lVar78 = *(long *)(sVar61 + 0x38);
            iVar85 = iVar85 + 1;
            bVar105 = uVar82 < (ulong)(*(long *)(sVar61 + 0x40) - lVar78 >> 3);
            uVar80 = uVar82;
            uVar82 = (ulong)((int)uVar82 + 1);
          } while (bVar105);
        }
      }
      pFVar56 = (Function *)(local_80._M_nxt + 1);
    } while (pFVar56 != (Function *)local_138._M_p);
  }
LAB_00751c24:
  (this->minified).state = 0;
  builder_2.wasm = (Module *)&this->exportedPrimaryFuncs;
  p_Var6 = &(this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var6->_M_header;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar50 = *(pointer *)(local_88.id + 8);
  for (HVar86.id = *local_88.id; (pointer)HVar86.id != puVar50; HVar86.id = HVar86.id + 8) {
    _Var15._M_head_impl =
         (((pointer)HVar86.id)->_M_t).
         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if ((_Var15._M_head_impl)->kind == Function) {
      if (*(__index_type *)((long)&(_Var15._M_head_impl)->value + 0x10) == '\0') {
        pvVar83 = &(_Var15._M_head_impl)->value;
      }
      else {
        pvVar83 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      }
      pmVar54 = std::
                map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                              *)builder_2.wasm,(key_type *)pvVar83);
      uVar35 = *(undefined4 *)((long)&(_Var15._M_head_impl)->name + 4);
      uVar36 = *(undefined4 *)((long)&(_Var15._M_head_impl)->name + 8);
      uVar37 = *(undefined4 *)((long)&(_Var15._M_head_impl)->name + 0xc);
      *(undefined4 *)&(pmVar54->super_IString).str._M_len =
           *(undefined4 *)&(_Var15._M_head_impl)->name;
      *(undefined4 *)((long)&(pmVar54->super_IString).str._M_len + 4) = uVar35;
      *(undefined4 *)&(pmVar54->super_IString).str._M_str = uVar36;
      *(undefined4 *)((long)&(pmVar54->super_IString).str._M_str + 4) = uVar37;
    }
  }
  local_148._8_8_ = &this->placeholderMap;
  p_Var6 = &(this->placeholderMap)._M_t._M_impl.super__Rb_tree_header;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->internalLoadSecondaryModule).super_IString.str._M_len = 0;
  (this->internalLoadSecondaryModule).super_IString.str._M_str = (char *)0x0;
  if (local_130->jspi == true) {
    name.super_IString.str._M_str = (char *)DAT_010d0e68.id;
    name.super_IString.str._M_len = (size_t)LOAD_SECONDARY_MODULE;
    pEVar53 = Module::getExportOrNull(this->primary,name);
    HVar86.id = DAT_010d0e68.id;
    pEVar89 = LOAD_SECONDARY_MODULE;
    if ((pEVar53 == (Export *)0x0) || (pEVar53->kind != Function)) {
      HeapType::HeapType((HeapType *)auStack_b8,(Signature)ZEXT816(0));
      auStack_278._0_4_ = 0;
      auStack_278._4_4_ = 0;
      segmentReferrerCollector.wasm._0_4_ = 0;
      segmentReferrerCollector.wasm._4_4_ = 0;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = segmentReferrerCollector._16_8_;
      segmentReferrerCollector._8_16_ = auVar40 << 0x40;
      name_01.super_IString.str._M_str = (char *)pEVar89;
      name_01.super_IString.str._M_len = (size_t)&segment_1;
      Builder::makeFunction
                (name_01,HVar86,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_b8,
                 (Expression *)auStack_278);
      pvVar39 = (void *)CONCAT44(auStack_278._4_4_,auStack_278._0_4_);
      if (pvVar39 != (void *)0x0) {
        operator_delete(pvVar39,segmentReferrerCollector._8_8_ - (long)pvVar39);
      }
      segment_1[3]._M_t.
      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = ENV;
      segment_1[4]._M_t.
      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = DAT_010d1118;
      segment_1[5]._M_t.
      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = LOAD_SECONDARY_MODULE;
      segment_1[6]._M_t.
      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
           (ElementSegment *)DAT_010d0e68.id;
      Module::addFunction(this->primary,
                          (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                          &segment_1);
      pEVar89 = (ElementSegment *)DAT_010d0e68.id;
      (this->internalLoadSecondaryModule).super_IString.str._M_len = (size_t)LOAD_SECONDARY_MODULE;
      (this->internalLoadSecondaryModule).super_IString.str._M_str = (char *)pEVar89;
      if (segment_1 !=
          (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)0x0) {
        std::default_delete<wasm::Function>::operator()
                  ((default_delete<wasm::Function> *)&segment_1,(Function *)segment_1);
      }
    }
    else {
      pvVar83 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      if (*(__index_type *)
           ((long)&(pEVar53->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) == '\0') {
        pvVar83 = &pEVar53->value;
      }
      pcVar87 = *(char **)((long)&(pvVar83->super__Variant_base<wasm::Name,_wasm::HeapType>).
                                  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                                  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u + 8)
      ;
      (this->internalLoadSecondaryModule).super_IString.str._M_len =
           *(size_t *)
            &(pvVar83->super__Variant_base<wasm::Name,_wasm::HeapType>).
             super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
             super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
             super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
             super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
             super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
      (this->internalLoadSecondaryModule).super_IString.str._M_str = pcVar87;
      name_00.super_IString.str._M_str = (char *)DAT_010d0e68.id;
      name_00.super_IString.str._M_len = (size_t)LOAD_SECONDARY_MODULE;
      Module::removeExport(this->primary,name_00);
    }
    pEVar29 = DAT_010d0e78;
    pEVar89 = ModuleSplitting::(anonymous_namespace)::LOAD_SECONDARY_STATUS;
    pMVar48 = this->primary;
    auStack_278._0_4_ = SUB84(pMVar48,0);
    auStack_278._4_4_ = (undefined4)((ulong)pMVar48 >> 0x20);
    pEVar55 = (ElementSegment *)Builder::makeConst<int>((Builder *)auStack_278,0);
    segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                operator_new(0x50);
    segment_1[8]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
    segment_1[9]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
    segment_1[6]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
    segment_1[7]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
    segment_1[4]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
    segment_1[5]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
    segment_1[2]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
    segment_1[3]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
    (segment_1->_M_t).
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
    segment_1[1]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
    (segment_1->_M_t).
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar89;
    segment_1[1]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar29;
    segment_1[7]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x2;
    segment_1[8]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar55;
    *(undefined1 *)
     &segment_1[9]._M_t.
      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = 1;
    Module::addGlobal(pMVar48,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                              &segment_1);
    if (segment_1 !=
        (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)0x0) {
      operator_delete(segment_1,0x50);
    }
    pEVar29 = DAT_010d0e78;
    pEVar89 = ModuleSplitting::(anonymous_namespace)::LOAD_SECONDARY_STATUS;
    pMVar48 = this->primary;
    segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                operator_new(0x30);
    pEVar55 = DAT_010d0e78;
    segment_1[3]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
         ModuleSplitting::(anonymous_namespace)::LOAD_SECONDARY_STATUS;
    segment_1[4]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar55;
    (segment_1->_M_t).
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar89;
    segment_1[1]._M_t.
    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar29;
    *(undefined4 *)
     &segment_1[2]._M_t.
      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = 3;
    *(undefined1 *)
     &segment_1[5]._M_t.
      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = 0;
    Module::addExport(pMVar48,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                              &segment_1);
    if (segment_1 !=
        (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)0x0) {
      operator_delete(segment_1,0x30);
    }
  }
  psVar16 = this->secondaryFuncs;
  for (p_Var49 = (psVar16->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var49 != &(psVar16->_M_t)._M_impl.super__Rb_tree_header;
      p_Var49 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var49)) {
    IVar108.str = *(string_view *)(p_Var49 + 1);
    pFVar56 = Module::getFunction(this->primary,(Name)*(string_view *)(p_Var49 + 1));
    segmentReferrerCollector._16_1_ = 0;
    segmentReferrers._M_h._M_before_begin._M_nxt =
         segmentReferrers._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auStack_278;
    wasm::ModuleUtils::copyFunction
              ((ModuleUtils *)pFVar56,(Function *)this->secondary,(Module *)0x0,
               (Name)(auVar34 << 0x40),
               (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&segment_1,
               (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    if (((char)segmentReferrers._M_h._M_before_begin._M_nxt == '\x01') &&
       (segmentReferrers._M_h._M_before_begin._M_nxt =
             segmentReferrers._M_h._M_before_begin._M_nxt & 0xffffffffffffff00,
       segment_1 !=
       (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)0x0)) {
      operator_delete(segment_1,segmentReferrers._M_h._M_bucket_count - (long)segment_1);
    }
    if (segmentReferrerCollector._16_1_ == '\x01') {
      segmentReferrerCollector._16_1_ = 0;
      pvVar39 = (void *)CONCAT44(auStack_278._4_4_,auStack_278._0_4_);
      if (pvVar39 != (void *)0x0) {
        operator_delete(pvVar39,segmentReferrerCollector._8_8_ - (long)pvVar39);
      }
    }
    Module::removeFunction(this->primary,(Name)IVar108.str);
  }
  auStack_b8 = (undefined1  [8])this->primary;
  pCVar99 = (Config *)
            (((Module *)auStack_b8)->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar95 = (Config *)
            (((Module *)auStack_b8)->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pCVar45 = pCVar95;
  if (pCVar99 != pCVar95) {
    do {
      local_130 = pCVar45;
      lVar78 = *(long *)&(pCVar99->secondaryFuncs)._M_t._M_impl;
      if (*(int *)(lVar78 + 0x10) == 0) {
        p_Var28 = &this->secondaryFuncs->_M_t;
        __k = (key_type *)(lVar78 + 0x18);
        if (*(char *)(lVar78 + 0x28) != '\0') {
          __k = (key_type *)0x0;
        }
        cVar65 = std::
                 _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 ::find(p_Var28,__k);
        if ((_Rb_tree_header *)cVar65._M_node != &(p_Var28->_M_impl).super__Rb_tree_header) {
          lVar78 = *(long *)&(pCVar99->secondaryFuncs)._M_t._M_impl;
          psVar81 = (string_view *)(lVar78 + 0x18);
          if (*(char *)(lVar78 + 0x28) != '\0') {
            psVar81 = (string_view *)0x0;
          }
          pFVar56 = (Function *)psVar81->_M_len;
          HVar86.id = (uintptr_t)psVar81->_M_str;
          sVar106 = *psVar81;
          pFVar68 = Module::getFunctionOrNull(this->primary,(Name)*psVar81);
          if (pFVar68 == (Function *)0x0) {
            pMVar48 = this->primary;
            pFVar68 = Module::getFunction(this->secondary,(Name)sVar106);
            auStack_278._0_4_ = 0;
            auStack_278._4_4_ = 0;
            segmentReferrerCollector.wasm._0_4_ = 0;
            segmentReferrerCollector.wasm._4_4_ = 0;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = segmentReferrerCollector._16_8_;
            segmentReferrerCollector._8_16_ = auVar41 << 0x40;
            name_02.super_IString.str._M_str = (char *)pFVar56;
            name_02.super_IString.str._M_len = (size_t)&segment_1;
            local_80._M_nxt = (_Hash_node_base *)pFVar56;
            Builder::makeFunction
                      (name_02,HVar86,
                       (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(pFVar68->type).id,
                       (Expression *)auStack_278);
            pFVar56 = Module::addFunction(pMVar48,(
                                                  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                                  *)&segment_1);
            if (segment_1 !=
                (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)0x0)
            {
              std::default_delete<wasm::Function>::operator()
                        ((default_delete<wasm::Function> *)&segment_1,(Function *)segment_1);
            }
            segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         *)0x0;
            pvVar39 = (void *)CONCAT44(auStack_278._4_4_,auStack_278._0_4_);
            if (pvVar39 != (void *)0x0) {
              operator_delete(pvVar39,segmentReferrerCollector._8_8_ - (long)pvVar39);
            }
            segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         *)0x0;
            segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x0;
            segmentReferrers._M_h._M_bucket_count = 0;
            SVar107 = HeapType::getSignature(&pFVar56->type);
            auStack_e8 = (undefined1  [8])SVar107.params.id;
            local_138._M_p = (pointer)pFVar56;
            local_88.id = (uintptr_t)&pFVar56->type;
            sVar61 = wasm::Type::size((Type *)auStack_e8);
            if (sVar61 != 0) {
              sVar96 = 0;
              do {
                auStack_278 = (undefined1  [8])auStack_e8;
                segmentReferrerCollector.wasm._0_4_ = (undefined4)sVar96;
                uVar35 = segmentReferrerCollector.wasm._0_4_;
                segmentReferrerCollector.wasm._4_4_ = (undefined4)(sVar96 >> 0x20);
                pTVar57 = wasm::Type::Iterator::operator*((Iterator *)auStack_278);
                uVar17 = pTVar57->id;
                auStack_108 = (undefined1  [8])
                              MixedArena::allocSpace
                                        ((MixedArena *)((long)auStack_b8 + 0x200),0x18,8);
                *(Id *)&(((Function *)auStack_108)->super_Importable).super_Named.name.super_IString
                        .str._M_len = LocalGetId;
                *(undefined4 *)
                 &(((Function *)auStack_108)->super_Importable).super_Named.hasExplicitName = uVar35
                ;
                ((Type *)&(((Function *)auStack_108)->super_Importable).super_Named.name.
                          super_IString.str._M_str)->id = uVar17;
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&segment_1
                           ,(Expression **)auStack_108);
                sVar96 = sVar96 + 1;
              } while (sVar61 != sVar96);
            }
            TVar62.id = local_88.id;
            func.super_IString.str._M_str = (char *)HVar86.id;
            func.super_IString.str._M_len = (size_t)local_80._M_nxt;
            TableSlotManager::getSlot
                      ((Slot *)auStack_278,(TableSlotManager *)local_148._0_8_,func,
                       (HeapType)*local_88.id);
            table.super_IString.str._M_str._0_4_ = segmentReferrerCollector.wasm._0_4_;
            table.super_IString.str._M_len = (size_t)auStack_278;
            table.super_IString.str._M_str._4_4_ = segmentReferrerCollector.wasm._4_4_;
            pEVar76 = TableSlotManager::Slot::makeExpr((Slot *)auStack_278,this->primary);
            pCVar58 = Builder::
                      makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                                ((Builder *)auStack_b8,table,pEVar76,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &segment_1,(HeapType)*TVar62.id,false);
            pCVar95 = local_130;
            *(CallIndirect **)(local_138._M_p + 0x60) = pCVar58;
            if (segment_1 !=
                (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)0x0)
            {
              operator_delete(segment_1,segmentReferrers._M_h._M_bucket_count - (long)segment_1);
            }
          }
        }
      }
      pCVar99 = (Config *)&(pCVar99->secondaryFuncs)._M_t._M_impl.super__Rb_tree_header;
      pCVar45 = local_130;
    } while (pCVar99 != pCVar95);
  }
  auStack_198._0_8_ = auStack_198 + 0x30;
  auStack_278._0_4_ = 0;
  auStack_278._4_4_ = 0;
  segmentReferrerCollector.wasm._0_4_ = 0;
  segmentReferrerCollector.wasm._4_4_ = 0;
  auStack_198._8_8_ = (DylinkSection *)0x1;
  auStack_198._16_8_ = (_Hash_node_base *)0x0;
  auStack_198._24_8_ = (pointer)0x0;
  auStack_198._32_4_ = 1.0;
  auStack_198._40_8_ = (pointer)0x0;
  auStack_198._48_8_ = (pointer)0x0;
  local_160._0_8_ = local_160;
  local_150 = 0;
  pMVar48 = this->primary;
  pp_Var88 = (((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                *)&pMVar48->globals)->_M_h)._M_buckets;
  pp_Var18 = (__buckets_ptr)
             (((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                *)&pMVar48->globals)->_M_h)._M_bucket_count;
  local_160._8_8_ = local_160._0_8_;
  if (pp_Var88 != pp_Var18) {
    do {
      if ((*pp_Var88)[4]._M_nxt == (_Hash_node_base *)0x0) {
        Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                  ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)auStack_278,
                   (Expression **)(*pp_Var88 + 8));
      }
      pp_Var88 = pp_Var88 + 1;
    } while (pp_Var88 != pp_Var18);
  }
  puVar91 = (pMVar48->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (pMVar48->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar91 != puVar10) {
    do {
      _Var19._M_head_impl =
           (puVar91->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(_Var19._M_head_impl)->super_Importable + 0x20) == (char *)0x0) {
        Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                  ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)auStack_278,
                   &(_Var19._M_head_impl)->body);
      }
      puVar91 = puVar91 + 1;
    } while (puVar91 != puVar10);
  }
  pFVar56 = (Function *)
            (pMVar48->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_80._M_nxt =
       (_Hash_node_base *)
       (pMVar48->elementSegments).
       super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.id = (uintptr_t)pMVar48;
  if (pFVar56 != (Function *)local_80._M_nxt) {
    do {
      sVar61 = (pFVar56->super_Importable).super_Named.name.super_IString.str._M_len;
      if (*(long *)(sVar61 + 0x20) != 0) {
        Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                  ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)auStack_278,
                   (Expression **)(sVar61 + 0x28));
      }
      puVar20 = *(undefined8 **)(sVar61 + 0x40);
      for (puVar60 = *(undefined8 **)(sVar61 + 0x38); puVar60 != puVar20; puVar60 = puVar60 + 1) {
        segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                    *puVar60;
        Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                  ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)auStack_278,
                   (Expression **)&segment_1);
      }
      pFVar56 = (Function *)&(pFVar56->super_Importable).super_Named.name.super_IString.str._M_str;
    } while (pFVar56 != (Function *)local_80._M_nxt);
  }
  p_Var100 = (__node_base_ptr)
             (((vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                *)(local_88.id + 0x90))->
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  p_Var21 = *(__node_base_ptr *)(local_88.id + 0x98);
  if (p_Var100 != p_Var21) {
    do {
      if (*(char *)&p_Var100->_M_nxt[5]._M_nxt == '\0') {
        Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                  ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)auStack_278,
                   (Expression **)(p_Var100->_M_nxt + 6));
      }
      p_Var100 = p_Var100 + 1;
    } while (p_Var100 != p_Var21);
  }
  segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
              &segmentReferrers._M_h._M_rehash_policy._M_next_resize;
  segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x1;
  segmentReferrers._M_h._M_bucket_count = 0;
  segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  segmentReferrers._M_h._M_element_count =
       CONCAT44(segmentReferrers._M_h._M_element_count._4_4_,0x3f800000);
  segmentReferrers._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  segmentReferrers._M_h._M_rehash_policy._4_4_ = 0;
  segmentReferrers._M_h._M_rehash_policy._M_next_resize = 0;
  pEVar89 = (this->tableManager).activeSegment;
  if (pEVar89 != (ElementSegment *)0x0) {
    ppEVar102 = (pEVar89->data).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    ppEVar22 = (pEVar89->data).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppEVar102 != ppEVar22) {
      do {
        auStack_e8 = (undefined1  [8])*ppEVar102;
        if (*(char *)&(((Table *)auStack_e8)->super_Importable).super_Named.name.super_IString.str.
                      _M_len != '+') {
          auStack_e8 = (undefined1  [8])0x0;
        }
        if (auStack_e8 != (undefined1  [8])0x0) {
          auStack_b8 = (undefined1  [8])&segment_1;
          std::
          _Hashtable<wasm::RefFunc*,wasm::RefFunc*,std::allocator<wasm::RefFunc*>,std::__detail::_Identity,std::equal_to<wasm::RefFunc*>,std::hash<wasm::RefFunc*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<wasm::RefFunc*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::RefFunc*,false>>>>
                    ((_Hashtable<wasm::RefFunc*,wasm::RefFunc*,std::allocator<wasm::RefFunc*>,std::__detail::_Identity,std::equal_to<wasm::RefFunc*>,std::hash<wasm::RefFunc*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)auStack_b8,auStack_e8,auStack_b8);
        }
        ppEVar102 = ppEVar102 + 1;
      } while (ppEVar102 != ppEVar22);
    }
  }
  local_290.wasm = this->primary;
  pFVar56 = (Function *)local_160._0_8_;
  if ((Function *)local_160._0_8_ != (Function *)local_160) {
    do {
      auStack_128 = (undefined1  [8])0x0;
      relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      pcVar23 = (char *)(pFVar56->super_Importable).base.super_IString.str._M_len;
      local_80._M_nxt = (_Hash_node_base *)pFVar56;
      for (pcVar87 = (pFVar56->super_Importable).module.super_IString.str._M_str;
          _Var73._M_nxt = local_80._M_nxt, pcVar87 != pcVar23; pcVar87 = pcVar87 + 8) {
        auStack_b8 = *(undefined1 (*) [8])pcVar87;
        if ((((Module *)auStack_b8)->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)(((Name *)(local_80._M_nxt + 3))->super_IString).str._M_len) {
          __assert_fail("refFunc->func == name",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                        ,0x261,
                        "void wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::indirectReferencesToSecondaryFunctions()"
                       );
        }
        sVar59 = std::
                 _Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&segment_1,(key_type *)auStack_b8);
        if (sVar59 == 0) {
          if (relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::vector<wasm::RefFunc*,std::allocator<wasm::RefFunc*>>::
            _M_realloc_insert<wasm::RefFunc*const&>
                      ((vector<wasm::RefFunc*,std::allocator<wasm::RefFunc*>> *)auStack_128,
                       (iterator)
                       relevantRefFuncs.
                       super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>._M_impl
                       .super__Vector_impl_data._M_start,(RefFunc **)auStack_b8);
          }
          else {
            *relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
             _M_impl.super__Vector_impl_data._M_start = (RefFunc *)auStack_b8;
            relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 relevantRefFuncs.
                 super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
        }
      }
      if (auStack_128 !=
          (undefined1  [8])
          relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        pFVar56 = Module::getFunction(this->secondary,(Name)*(string_view *)(local_80._M_nxt + 2));
        pMVar48 = this->primary;
        local_d8._0_7_ = 0x6c6f706d617274;
        local_d8._7_4_ = 0x5f656e69;
        params.id = 0xb;
        local_d8[0xb] = 0;
        sVar61 = (((Name *)(_Var73._M_nxt + 3))->super_IString).str._M_len;
        auStack_108 = (undefined1  [8])local_f8;
        auStack_e8 = (undefined1  [8])local_d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_108,sVar61,*(long *)(_Var73._M_nxt + 2) + sVar61);
        pp_Var88 = (__buckets_ptr)0xf;
        if (auStack_e8 != (undefined1  [8])local_d8) {
          pp_Var88 = (__buckets_ptr)CONCAT17(local_d8[7],local_d8._0_7_);
        }
        if (pp_Var88 <
            (__buckets_ptr)
            ((long)placeholder._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + params.id)) {
          pp_Var88 = (__buckets_ptr)0xf;
          if (auStack_108 != (undefined1  [8])local_f8) {
            pp_Var88 = (__buckets_ptr)local_f8._0_8_;
          }
          if (pp_Var88 <
              (__buckets_ptr)
              ((long)placeholder._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + params.id))
          goto LAB_007525f2;
          puVar60 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)auStack_108,0,(char *)0x0,(ulong)auStack_e8);
        }
        else {
LAB_007525f2:
          puVar60 = (undefined8 *)std::__cxx11::string::_M_append(auStack_e8,(ulong)auStack_108);
        }
        p_Var1 = (_func_void *)(puVar60 + 2);
        if ((_func_void *)*puVar60 == p_Var1) {
          local_a8._0_8_ = *(undefined8 *)p_Var1;
          local_a8._8_8_ = puVar60[3];
          auStack_b8 = (undefined1  [8])local_a8;
        }
        else {
          local_a8._0_8_ = *(undefined8 *)p_Var1;
          auStack_b8 = (undefined1  [8])*puVar60;
        }
        builder_1.wasm = (Module *)puVar60[1];
        *puVar60 = p_Var1;
        puVar60[1] = 0;
        *p_Var1 = (_func_void)0x0;
        sVar106._M_str = (char *)0x0;
        sVar106._M_len = (size_t)auStack_b8;
        sVar106 = IString::interned((IString *)builder_1.wasm,sVar106,SUB81(p_Var1,0));
        sVar106 = (string_view)Names::getValidFunctionName(pMVar48,(Name)sVar106);
        if (auStack_b8 != (undefined1  [8])local_a8) {
          operator_delete((void *)auStack_b8,(ulong)(local_a8._0_8_ + 1));
        }
        if (auStack_108 != (undefined1  [8])local_f8) {
          operator_delete((void *)auStack_108,(ulong)(local_f8._0_8_ + 1));
        }
        if (auStack_e8 != (undefined1  [8])local_d8) {
          operator_delete((void *)auStack_e8,CONCAT17(local_d8[7],local_d8._0_7_) + 1);
        }
        auStack_b8 = (undefined1  [8])0x0;
        builder_1.wasm = (Module *)0x0;
        local_a8._0_8_ = (ElementSegment *)0x0;
        uVar80 = 0;
        while( true ) {
          sVar61 = Function::getNumParams(pFVar56);
          index = (Index)uVar80;
          if (sVar61 <= uVar80) break;
          TVar62 = Function::getLocalType(pFVar56,index);
          auStack_e8 = (undefined1  [8])MixedArena::allocSpace(&(local_290.wasm)->allocator,0x18,8);
          *(undefined1 *)&((_Hash_node_base *)auStack_e8)->_M_nxt = 8;
          *(Index *)&((_Hash_node_base *)((long)auStack_e8 + 0x10))->_M_nxt = index;
          ((_Hash_node_base *)((long)auStack_e8 + 8))->_M_nxt = (_Hash_node_base *)TVar62.id;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_b8,
                     (Expression **)auStack_e8);
          uVar80 = (ulong)(index + 1);
        }
        IVar108.str = *(string_view *)(local_80._M_nxt + 2);
        SVar107 = HeapType::getSignature(&pFVar56->type);
        Builder::makeCall(&local_290,(Name)IVar108.str,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          auStack_b8,SVar107.results.id,false);
        pMVar48 = this->primary;
        auStack_e8 = (undefined1  [8])0x0;
        params.id = 0;
        local_d8._0_7_ = 0;
        local_d8[7] = 0;
        name_03.super_IString.str._M_str = (char *)sVar106._M_len;
        name_03.super_IString.str._M_len = (size_t)auStack_108;
        Builder::makeFunction
                  (name_03,(HeapType)sVar106._M_str,
                   (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(pFVar56->type).id,
                   (Expression *)auStack_e8);
        Module::addFunction(pMVar48,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                     *)auStack_108);
        _Var73._M_nxt = local_80._M_nxt;
        if (auStack_108 != (undefined1  [8])0x0) {
          std::default_delete<wasm::Function>::operator()
                    ((default_delete<wasm::Function> *)auStack_108,(Function *)auStack_108);
        }
        auStack_108 = (undefined1  [8])0x0;
        auVar63 = auStack_128;
        if (auStack_e8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_e8,CONCAT17(local_d8[7],local_d8._0_7_) - (long)auStack_e8
                         );
          auVar63 = auStack_128;
        }
        for (; auVar63 !=
               (undefined1  [8])
               relevantRefFuncs.
               super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>._M_impl.
               super__Vector_impl_data._M_start; auVar63 = (undefined1  [8])((long)auVar63 + 8)) {
          ((*(RefFunc **)auVar63)->func).super_IString.str = sVar106;
        }
        if (auStack_b8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_b8,local_a8._0_8_ - (long)auStack_b8);
        }
      }
      if (auStack_128 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_128,
                        (long)relevantRefFuncs.
                              super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_128);
      }
      pFVar56 = (Function *)
                (((Function *)_Var73._M_nxt)->super_Importable).super_Named.name.super_IString.str.
                _M_len;
    } while (pFVar56 != (Function *)local_160);
  }
  std::
  _Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&segment_1);
  std::__cxx11::
  _List_base<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>
  ::_M_clear((_List_base<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>
              *)local_160);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)auStack_198);
  auStack_278._0_4_ = 0;
  auStack_278._4_4_ = 0;
  segmentReferrerCollector.wasm._0_4_ = 0;
  segmentReferrerCollector.wasm._4_4_ = 0;
  pMVar48 = this->primary;
  puVar90 = (pMVar48->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar24 = (pMVar48->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  auStack_198._0_8_ = pMVar48;
  if (puVar90 != puVar24) {
    do {
      pGVar25 = (puVar90->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar25->super_Importable).module + 8) == (char *)0x0) {
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::walk
                  ((Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_> *)auStack_278,
                   &pGVar25->init);
      }
      puVar90 = puVar90 + 1;
    } while (puVar90 != puVar24);
  }
  puVar91 = (pMVar48->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (pMVar48->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar91 != puVar10) {
    do {
      pFVar56 = (puVar91->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar56->super_Importable).module + 8) == (char *)0x0) {
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::walk
                  ((Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_> *)auStack_278,
                   &pFVar56->body);
      }
      puVar91 = puVar91 + 1;
    } while (puVar91 != puVar10);
  }
  puVar92 = (pMVar48->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar26 = (pMVar48->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar92 != puVar26) {
    do {
      pDVar27 = (puVar92->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar27->isPassive == false) {
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::walk
                  ((Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_> *)auStack_278,
                   &pDVar27->offset);
      }
      puVar92 = puVar92 + 1;
    } while (puVar92 != puVar26);
  }
  builder_1.wasm = (Module *)0x0;
  local_a8._8_8_ =
       std::
       _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:670:16)>
       ::_M_invoke;
  local_a8._0_8_ =
       std::
       _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:670:16)>
       ::_M_manager;
  auStack_b8 = (undefined1  [8])this;
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)auStack_278,this->secondary,(Func *)auStack_b8);
  if ((ElementSegment *)local_a8._0_8_ != (ElementSegment *)0x0) {
    (*(code *)local_a8._0_8_)(auStack_b8,auStack_b8,3);
  }
  segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&segmentReferrers;
  segmentReferrers._M_h._M_buckets =
       (__buckets_ptr)((ulong)segmentReferrers._M_h._M_buckets & 0xffffffff00000000);
  segmentReferrers._M_h._M_bucket_count = 0;
  segmentReferrers._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  segmentReferrers._M_h._M_rehash_policy._4_4_ = 0;
  p_Var49 = (_Rb_tree_node_base *)
            CONCAT44(segmentReferrerCollector._28_4_,segmentReferrerCollector._24_4_);
  _Var64._M_nxt = segmentReferrers._M_h._M_before_begin._M_nxt;
  segmentReferrers._M_h._M_element_count = (size_type)segmentReferrers._M_h._M_before_begin._M_nxt;
  if (p_Var49 != (_Rb_tree_node_base *)&segmentReferrerCollector.field_0x8) {
    do {
      p_Var9 = p_Var49[1]._M_left;
      auStack_e8 = (undefined1  [8])&segment_1;
      for (p_Var93 = p_Var49[1]._M_parent; p_Var93 != p_Var9; p_Var93 = (_Base_ptr)&p_Var93->_M_left
          ) {
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::
        _M_insert_unique_<wasm::Name&,std::_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>::_Alloc_node>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)&segment_1,(_Base_ptr)&segmentReferrers,(Name *)p_Var93,
                   (_Alloc_node *)auStack_e8);
      }
      p_Var49 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var49);
      _Var64 = segmentReferrers._M_h._M_before_begin;
    } while (p_Var49 != (_Rb_tree_node_base *)&segmentReferrerCollector.field_0x8);
  }
  for (; (_Rb_tree_node_base *)_Var64._M_nxt != (_Rb_tree_node_base *)&segmentReferrers;
      _Var64._M_nxt = (_Hash_node_base *)std::_Rb_tree_increment(_Var64._M_nxt)) {
    exportImportFunction(this,(Name)*(string_view *)((long)_Var64._M_nxt + 0x20));
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&segment_1);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
               *)&segmentReferrerCollector);
  if ((this->tableManager).activeTable != (Table *)0x0) {
    segmentReferrerCollector.wasm._0_4_ = 0;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = &segmentReferrerCollector;
    segmentReferrerCollector._8_16_ = auVar42 << 0x40;
    segmentReferrerCollector._32_1_ = 0;
    segmentReferrerCollector._33_7_ = 0;
    pCVar99 = (Config *)
              (this->primary->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    segmentReferrerCollector._24_8_ = &segmentReferrerCollector;
    pCVar45 = (Config *)
              (this->primary->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar95 = local_130;
    while (local_130 = pCVar45, local_130 != pCVar99) {
      local_88.id = *(uintptr_t *)&(local_130->secondaryFuncs)._M_t._M_impl;
      if ((((Module *)local_88.id)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        IString::interned((IString *)0x0,(string_view)ZEXT816(0xe85cd6),SUB81(local_130,0));
        pEVar76 = *(Expression **)(local_88.id + 0x28);
        local_138._M_p = (pointer)0x0;
        if (pEVar76->_id == ConstId) {
          if (*(long *)(pEVar76 + 2) != 2) {
LAB_00753b85:
            __assert_fail("type == Type::i32",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                          ,0x120,"int32_t wasm::Literal::geti32() const");
          }
          local_138._M_p = (pointer)(ulong)*(uint *)(pEVar76 + 1);
        }
        pFVar56 = *(Function **)(local_88.id + 0x38);
        if ((Function *)((__node_base *)(local_88.id + 0x40))->_M_nxt != pFVar56) {
          uVar80 = 0;
          do {
            auStack_128._0_4_ = (int)local_138._M_p + (int)uVar80;
            pcVar87 = (char *)(&(pFVar56->super_Importable).super_Named.name.super_IString.str.
                                _M_len)[uVar80];
            local_80._M_nxt = (_Hash_node_base *)pFVar56;
            if (*pcVar87 == '+') {
              p_Var28 = &this->secondaryFuncs->_M_t;
              cVar65 = std::
                       _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       ::find(p_Var28,(key_type *)(pcVar87 + 0x10));
              if ((_Rb_tree_header *)cVar65._M_node != &(p_Var28->_M_impl).super__Rb_tree_header) {
                segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             *)((ulong)auStack_128 & 0xffffffff);
                pmVar66 = std::
                          map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                          ::operator[]((map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                                        *)local_148._8_8_,(key_type_conflict *)&segment_1);
                pcVar23 = *(char **)(pcVar87 + 0x18);
                (pmVar66->super_IString).str._M_len =
                     (((key_type *)(pcVar87 + 0x10))->super_IString).str._M_len;
                (pmVar66->super_IString).str._M_str = pcVar23;
                pFVar56 = Module::getFunction(this->secondary,
                                              (Name)((IString *)(pcVar87 + 0x10))->str);
                ppFVar67 = std::
                           map<unsigned_int,_wasm::Function_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
                           ::operator[]((map<unsigned_int,_wasm::Function_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
                                         *)auStack_278,(key_type *)auStack_128);
                *ppFVar67 = pFVar56;
                if (this->config->usePlaceholders == false) {
                  segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                               *)this->primary;
                  pRVar69 = Builder::makeRefNull((Builder *)&segment_1,(HeapType)0x68);
                  local_80._M_nxt[uVar80]._M_nxt = (_Hash_node_base *)pRVar69;
                }
                else {
                  pFVar68 = (Function *)operator_new(0x1d8);
                  memset(pFVar68,0,0x1d8);
                  HeapType::HeapType(&pFVar68->type,(Signature)ZEXT816(0));
                  pFVar68->profile = Normal;
                  (pFVar68->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  (pFVar68->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  (pFVar68->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  pFVar68->body = (Expression *)0x0;
                  (pFVar68->localNames)._M_h._M_buckets =
                       &(pFVar68->localNames)._M_h._M_single_bucket;
                  uVar82 = 1;
                  (pFVar68->localNames)._M_h._M_bucket_count = 1;
                  (pFVar68->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                  (pFVar68->localNames)._M_h._M_element_count = 0;
                  (pFVar68->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
                  (pFVar68->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
                  (pFVar68->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                  (pFVar68->localIndices)._M_h._M_buckets =
                       &(pFVar68->localIndices)._M_h._M_single_bucket;
                  (pFVar68->localIndices)._M_h._M_bucket_count = 1;
                  (pFVar68->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                  (pFVar68->localIndices)._M_h._M_element_count = 0;
                  (pFVar68->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
                  (pFVar68->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
                  (pFVar68->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                  (pFVar68->debugLocations)._M_h._M_buckets =
                       &(pFVar68->debugLocations)._M_h._M_single_bucket;
                  (pFVar68->debugLocations)._M_h._M_bucket_count = 1;
                  (pFVar68->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                  (pFVar68->debugLocations)._M_h._M_element_count = 0;
                  (pFVar68->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
                  (pFVar68->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
                  (pFVar68->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                  (pFVar68->prologLocation).
                  super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
                  (pFVar68->epilogLocation).
                  super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
                  (pFVar68->expressionLocations)._M_h._M_buckets =
                       &(pFVar68->expressionLocations)._M_h._M_single_bucket;
                  (pFVar68->expressionLocations)._M_h._M_bucket_count = 1;
                  (pFVar68->expressionLocations)._M_h._M_before_begin._M_nxt =
                       (_Hash_node_base *)0x0;
                  (pFVar68->expressionLocations)._M_h._M_element_count = 0;
                  (pFVar68->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
                  (pFVar68->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
                  (pFVar68->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                  (pFVar68->delimiterLocations)._M_h._M_buckets =
                       &(pFVar68->delimiterLocations)._M_h._M_single_bucket;
                  (pFVar68->delimiterLocations)._M_h._M_bucket_count = 1;
                  (pFVar68->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0
                  ;
                  (pFVar68->delimiterLocations)._M_h._M_element_count = 0;
                  (pFVar68->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
                  *(undefined8 *)((long)&(pFVar68->delimiterLocations)._M_h._M_single_bucket + 4) =
                       0;
                  (pFVar68->funcLocation).declarations = 0;
                  (pFVar68->funcLocation).end = 0;
                  (pFVar68->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
                  (pFVar68->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                  (pFVar68->effects).
                  super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  (pFVar68->effects).
                  super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  pFVar68->noFullInline = false;
                  pFVar68->noPartialInline = false;
                  pcVar87 = (this->config->placeholderNamespace).super_IString.str._M_str;
                  (pFVar68->super_Importable).module.super_IString.str._M_len =
                       (this->config->placeholderNamespace).super_IString.str._M_len;
                  (pFVar68->super_Importable).module.super_IString.str._M_str = pcVar87;
                  uVar35 = auStack_128._0_4_;
                  cVar47 = '\x01';
                  psVar2 = &segmentReferrers._M_h._M_bucket_count;
                  if (9 < (uint)auStack_128._0_4_) {
                    uVar82 = (ulong)auStack_128 & 0xffffffff;
                    cVar46 = '\x04';
                    do {
                      cVar47 = cVar46;
                      uVar84 = (uint)uVar82;
                      if (uVar84 < 100) {
                        cVar47 = cVar47 + -2;
                        goto LAB_00752e4c;
                      }
                      if (uVar84 < 1000) {
                        cVar47 = cVar47 + -1;
                        goto LAB_00752e4c;
                      }
                      if (uVar84 < 10000) goto LAB_00752e4c;
                      uVar82 = uVar82 / 10000;
                      cVar46 = cVar47 + '\x04';
                    } while (99999 < uVar84);
                    cVar47 = cVar47 + '\x01';
                  }
LAB_00752e4c:
                  uVar77 = (undefined1)uVar82;
                  auStack_108 = (undefined1  [8])pFVar68;
                  segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                               *)psVar2;
                  std::__cxx11::string::_M_construct((ulong)&segment_1,cVar47);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)segment_1,(uint)segmentReferrers._M_h._M_buckets,uVar35);
                  s._M_str = (char *)0x0;
                  s._M_len = (size_t)segment_1;
                  sVar106 = IString::interned((IString *)segmentReferrers._M_h._M_buckets,s,
                                              (bool)uVar77);
                  *(string_view *)((long)auStack_108 + 0x28) = sVar106;
                  if (segment_1 !=
                      (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       *)psVar2) {
                    operator_delete(segment_1,segmentReferrers._M_h._M_bucket_count + 1);
                  }
                  pMVar48 = this->primary;
                  local_a8._0_8_ = (ElementSegment *)0x6c6f686563616c70;
                  builder_1.wasm = (Module *)0xc;
                  local_a8._8_5_ = 0x5f726564;
                  auStack_e8 = (undefined1  [8])local_d8;
                  auStack_b8 = (undefined1  [8])local_a8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)auStack_e8,*(char **)((long)auStack_108 + 0x30),
                             (char *)(((Name *)((long)auStack_108 + 0x28))->super_IString).str.
                                     _M_len + (long)*(char **)((long)auStack_108 + 0x30));
                  pEVar89 = (ElementSegment *)0xf;
                  if (auStack_b8 != (undefined1  [8])local_a8) {
                    pEVar89 = (ElementSegment *)local_a8._0_8_;
                  }
                  pEVar29 = (ElementSegment *)
                            ((long)&((builder_1.wasm)->exports).
                                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + params.id);
                  if (pEVar89 < pEVar29) {
                    pEVar89 = (ElementSegment *)0xf;
                    if (auStack_e8 != (undefined1  [8])local_d8) {
                      pEVar89 = (ElementSegment *)CONCAT17(local_d8[7],local_d8._0_7_);
                    }
                    if (pEVar89 < pEVar29) goto LAB_00752f50;
                    plVar70 = (long *)std::__cxx11::string::replace
                                                ((ulong)auStack_e8,0,(char *)0x0,(ulong)auStack_b8);
                  }
                  else {
LAB_00752f50:
                    plVar70 = (long *)std::__cxx11::string::_M_append(auStack_b8,(ulong)auStack_e8);
                  }
                  puVar3 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            *)(plVar70 + 2);
                  if ((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       *)*plVar70 == puVar3) {
                    segmentReferrers._M_h._M_bucket_count =
                         (size_type)
                         (puVar3->_M_t).
                         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
                    segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)plVar70[3];
                    segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                 *)psVar2;
                  }
                  else {
                    segmentReferrers._M_h._M_bucket_count =
                         (size_type)
                         (puVar3->_M_t).
                         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
                    segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                 *)*plVar70;
                  }
                  segmentReferrers._M_h._M_buckets = (__buckets_ptr)plVar70[1];
                  *plVar70 = (long)puVar3;
                  plVar70[1] = 0;
                  *(undefined1 *)
                   &(puVar3->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = 0;
                  s_00._M_str = (char *)0x0;
                  s_00._M_len = (size_t)segment_1;
                  sVar106 = IString::interned((IString *)segmentReferrers._M_h._M_buckets,s_00,
                                              SUB81(puVar3,0));
                  IVar108.str = (string_view)Names::getValidFunctionName(pMVar48,sVar106);
                  *(string_view *)auStack_108 = IVar108.str;
                  if (segment_1 !=
                      (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       *)psVar2) {
                    operator_delete(segment_1,segmentReferrers._M_h._M_bucket_count + 1);
                  }
                  if (auStack_e8 != (undefined1  [8])local_d8) {
                    operator_delete((void *)auStack_e8,CONCAT17(local_d8[7],local_d8._0_7_) + 1);
                  }
                  if (auStack_b8 != (undefined1  [8])local_a8) {
                    operator_delete((void *)auStack_b8,(ulong)(local_a8._0_8_ + 1));
                  }
                  *(bool *)((long)auStack_108 + 0x10) = true;
                  HVar86.id = (pFVar56->type).id;
                  ((HeapType *)((long)auStack_108 + 0x38))->id = HVar86.id;
                  sVar61 = *(size_t *)auStack_108;
                  pcVar87 = *(char **)((long)auStack_108 + 8);
                  pRVar71 = (RefFunc *)MixedArena::allocSpace(&this->primary->allocator,0x20,8);
                  (pRVar71->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id
                       = RefFuncId;
                  (pRVar71->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.
                  type.id = 0;
                  (pRVar71->func).super_IString.str._M_len = 0;
                  (pRVar71->func).super_IString.str._M_len = sVar61;
                  (pRVar71->func).super_IString.str._M_str = pcVar87;
                  RefFunc::finalize(pRVar71,HVar86);
                  local_80._M_nxt[uVar80]._M_nxt = (_Hash_node_base *)pRVar71;
                  Module::addFunction(this->primary,
                                      (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                       *)auStack_108);
                  if (auStack_108 != (undefined1  [8])0x0) {
                    std::default_delete<wasm::Function>::operator()
                              ((default_delete<wasm::Function> *)auStack_108,(Function *)auStack_108
                              );
                  }
                }
              }
            }
            uVar80 = (ulong)((int)uVar80 + 1);
            pFVar56 = *(Function **)(local_88.id + 0x38);
          } while (uVar80 < (ulong)((long)((__node_base *)(local_88.id + 0x40))->_M_nxt -
                                    (long)pFVar56 >> 3));
        }
      }
      pCVar95 = local_130;
      pCVar45 = (Config *)&(local_130->secondaryFuncs)._M_t._M_impl.super__Rb_tree_header;
    }
    local_130 = pCVar95;
    if (CONCAT71(segmentReferrerCollector._33_7_,segmentReferrerCollector._32_1_) != 0) {
      auStack_e8 = (undefined1  [8])
                   wasm::ModuleUtils::copyTable((this->tableManager).activeTable,this->secondary);
      if ((this->tableManager).activeBase.global.super_IString.str._M_len == 0) {
        segmentReferrers._M_h._M_buckets = (__buckets_ptr)auStack_128;
        auStack_128._0_4_ = *(undefined4 *)(segmentReferrerCollector._16_8_ + 0x20);
        auStack_b8 = (undefined1  [8])0x0;
        builder_1.wasm = (Module *)0x0;
        local_a8._0_8_ = (ElementSegment *)0x0;
        segmentReferrers._M_h._M_bucket_count = (size_type)auStack_e8;
        segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)auStack_b8;
        p_Var49 = (_Rb_tree_node_base *)segmentReferrerCollector._16_8_;
        segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                    this;
        while (p_Var49 != (_Rb_tree_node_base *)&segmentReferrerCollector) {
          if (((long)builder_1.wasm - (long)auStack_b8 >> 3) + ((ulong)auStack_128 & 0xffffffff) !=
              (ulong)p_Var49[1]._M_color) {
            setupTablePatching::anon_class_32_4_bf007958::operator()
                      ((anon_class_32_4_bf007958 *)&segment_1);
            auStack_128._0_4_ = p_Var49[1]._M_color;
            if ((undefined1  [8])builder_1.wasm != auStack_b8) {
              builder_1.wasm = (Module *)auStack_b8;
            }
          }
          p_Var93 = p_Var49[1]._M_parent;
          uVar14 = *(undefined8 *)p_Var93;
          p_Var9 = p_Var93->_M_parent;
          HVar86.id = (uintptr_t)p_Var93[1]._M_right;
          pFVar56 = (Function *)MixedArena::allocSpace(&this->secondary->allocator,0x20,8);
          *(Id *)&(pFVar56->super_Importable).super_Named.name.super_IString.str._M_len = RefFuncId;
          ((Type *)&(pFVar56->super_Importable).super_Named.name.super_IString.str._M_str)->id = 0;
          *(undefined8 *)&(pFVar56->super_Importable).super_Named.hasExplicitName = 0;
          *(undefined8 *)&(pFVar56->super_Importable).super_Named.hasExplicitName = uVar14;
          (pFVar56->super_Importable).module.super_IString.str._M_len = (size_t)p_Var9;
          RefFunc::finalize((RefFunc *)pFVar56,HVar86);
          auStack_108 = (undefined1  [8])pFVar56;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_b8,
                     (Expression **)auStack_108);
          p_Var49 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var49);
        }
        if ((undefined1  [8])builder_1.wasm != auStack_b8) {
          setupTablePatching::anon_class_32_4_bf007958::operator()
                    ((anon_class_32_4_bf007958 *)&segment_1);
        }
      }
      else {
        ppEVar98 = (this->tableManager).activeTableSegments.
                   super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((long)(this->tableManager).activeTableSegments.
                  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar98 != 8) {
          __assert_fail("tableManager.activeTableSegments.size() == 1 && \"Unexpected number of segments with non-const base\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                        ,0x2ee,
                        "void wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::setupTablePatching()"
                       );
        }
        pMVar48 = this->secondary;
        if (((long)(pMVar48->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pMVar48->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start != 8) ||
           ((pMVar48->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pMVar48->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          __assert_fail("secondary.tables.size() == 1 && secondary.elementSegments.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                        ,0x2ef,
                        "void wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::setupTablePatching()"
                       );
        }
        TVar62.id = (uintptr_t)*ppEVar98;
        auStack_b8 = (undefined1  [8])0x0;
        builder_1.wasm = (Module *)0x0;
        local_a8._0_8_ = (Module *)0x0;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::reserve
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_b8,
                   (long)((long)(((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                                   *)&((Module *)TVar62.id)->globals)->_M_h)._M_before_begin._M_nxt
                         - (((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                              *)&((Module *)TVar62.id)->globals)->_M_h)._M_bucket_count) >> 3);
        p_Var72 = (_Hash_node_base *)
                  (((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)&((Module *)TVar62.id)->globals)->_M_h)._M_bucket_count;
        if ((ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
             *)segmentReferrerCollector._16_8_ != &segmentReferrerCollector &&
            (((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
               *)&((Module *)TVar62.id)->globals)->_M_h)._M_before_begin._M_nxt != p_Var72) {
          uVar84 = 1;
          uVar80 = 0;
          _Var73._M_nxt = (_Hash_node_base *)segmentReferrerCollector._16_8_;
          local_88.id = TVar62.id;
          do {
            if (uVar84 - 1 ==
                *(int *)&(((Function *)_Var73._M_nxt)->super_Importable).module.super_IString.str.
                         _M_str) {
              psVar52 = (size_t *)
                        (((Function *)_Var73._M_nxt)->super_Importable).base.super_IString.str.
                        _M_len;
              sVar61 = *psVar52;
              pcVar87 = (char *)psVar52[1];
              HVar86.id = psVar52[7];
              local_80._M_nxt = _Var73._M_nxt;
              pRVar71 = (RefFunc *)MixedArena::allocSpace(&this->secondary->allocator,0x20,8);
              (pRVar71->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id =
                   RefFuncId;
              (pRVar71->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id
                   = 0;
              (pRVar71->func).super_IString.str._M_len = 0;
              (pRVar71->func).super_IString.str._M_len = sVar61;
              (pRVar71->func).super_IString.str._M_str = pcVar87;
              RefFunc::finalize(pRVar71,HVar86);
              segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                           *)pRVar71;
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_b8,
                         (Expression **)&segment_1);
              _Var73._M_nxt = (_Hash_node_base *)std::_Rb_tree_increment(local_80._M_nxt);
              TVar62.id = local_88.id;
            }
            else if (*(char *)&(p_Var72[uVar80]._M_nxt)->_M_nxt == '+') {
              local_80._M_nxt = _Var73._M_nxt;
              exportImportFunction(this,(IString)*(IString *)&p_Var72[uVar80]._M_nxt[2]._M_nxt);
              segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                           *)0x0;
              segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x0;
              segmentReferrers._M_h._M_before_begin._M_nxt =
                   (_Hash_node_base *)
                   std::
                   _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                   ::_M_invoke;
              segmentReferrers._M_h._M_bucket_count =
                   (size_type)
                   std::
                   _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                   ::_M_manager;
              pFVar56 = (Function *)
                        ExpressionManipulator::flexibleCopy
                                  (*(Expression **)
                                    ((((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                                        *)&((Module *)TVar62.id)->globals)->_M_h)._M_bucket_count +
                                    uVar80 * 8),this->secondary,(CustomCopier *)&segment_1);
              if (segmentReferrers._M_h._M_bucket_count != 0) {
                (*(code *)segmentReferrers._M_h._M_bucket_count)(&segment_1,&segment_1,3);
              }
              auStack_108 = (undefined1  [8])pFVar56;
              if (builder_1.wasm == (Module *)local_a8._0_8_) {
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                _M_realloc_insert<wasm::Expression*const&>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_b8
                           ,(iterator)builder_1.wasm,(Expression **)auStack_108);
                _Var73._M_nxt = local_80._M_nxt;
              }
              else {
                ((builder_1.wasm)->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pFVar56;
                builder_1.wasm =
                     (Module *)
                     &((builder_1.wasm)->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
                _Var73._M_nxt = local_80._M_nxt;
              }
            }
            if ((Function *)_Var73._M_nxt == (Function *)&segmentReferrerCollector) break;
            uVar80 = (ulong)uVar84;
            p_Var72 = (_Hash_node_base *)
                      (((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                         *)&((Module *)TVar62.id)->globals)->_M_h)._M_bucket_count;
            uVar84 = uVar84 + 1;
          } while (uVar80 < (ulong)((long)(((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                                             *)&((Module *)TVar62.id)->globals)->_M_h).
                                          _M_before_begin._M_nxt - (long)p_Var72 >> 3));
        }
        segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                    0x0;
        segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x0;
        segmentReferrers._M_h._M_before_begin._M_nxt =
             (_Hash_node_base *)
             std::
             _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
             ::_M_invoke;
        segmentReferrers._M_h._M_bucket_count =
             (size_type)
             std::
             _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
             ::_M_manager;
        pEVar89 = (ElementSegment *)
                  ExpressionManipulator::flexibleCopy
                            ((Expression *)
                             (((Module *)TVar62.id)->functions).
                             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,this->secondary,
                             (CustomCopier *)&segment_1);
        if (segmentReferrers._M_h._M_bucket_count != 0) {
          (*(code *)segmentReferrers._M_h._M_bucket_count)(&segment_1,&segment_1,3);
        }
        auVar63 = auStack_e8;
        segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                    operator_new(0x50);
        auVar44 = auStack_b8;
        pEVar55 = (ElementSegment *)
                  (((Importable *)auVar63)->super_Named).name.super_IString.str._M_len;
        pEVar38 = *(ElementSegment **)((long)auVar63 + 8);
        pEVar29 = (ElementSegment *)((Type *)((long)auVar63 + 0x50))->id;
        (segment_1->_M_t).
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
        segment_1[1]._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
        *(undefined1 *)
         &segment_1[2]._M_t.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = 0;
        segment_1[3]._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar55;
        segment_1[4]._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar38;
        segment_1[5]._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar89;
        segment_1[6]._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar29;
        segment_1[7]._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
        segment_1[8]._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
        segment_1[9]._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
        auStack_b8 = (undefined1  [8])0x0;
        pMVar48 = (Module *)
                  segment_1[8]._M_t.
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        pEVar89 = segment_1[9]._M_t.
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        segment_1[7]._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
             (ElementSegment *)auVar44;
        segment_1[8]._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
             (ElementSegment *)builder_1.wasm;
        segment_1[9]._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
             (ElementSegment *)local_a8._0_8_;
        pEVar29 = (ElementSegment *)
                  (((Module *)TVar62.id)->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar77 = *(undefined1 *)
                  &(((Module *)TVar62.id)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (segment_1->_M_t).
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
             (ElementSegment *)
             (((Module *)TVar62.id)->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        segment_1[1]._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = pEVar29;
        *(undefined1 *)
         &segment_1[2]._M_t.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = uVar77;
        builder_1.wasm = pMVar48;
        local_a8._0_8_ = pEVar89;
        Module::addElementSegment
                  (this->secondary,
                   (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                   &segment_1);
        if (segment_1 !=
            (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)0x0) {
          std::default_delete<wasm::ElementSegment>::operator()
                    ((default_delete<wasm::ElementSegment> *)&segment_1,(ElementSegment *)segment_1)
          ;
        }
      }
      if (auStack_b8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_b8,local_a8._0_8_ - (long)auStack_b8);
      }
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
                 *)auStack_278);
  }
  auStack_278 = (undefined1  [8])&segmentReferrerCollector.field_0x28;
  segmentReferrerCollector.wasm._0_4_ = 1;
  segmentReferrerCollector.wasm._4_4_ = 0;
  segmentReferrerCollector._8_16_ = ZEXT816(0);
  segmentReferrerCollector._24_4_ = 0x3f800000;
  segmentReferrerCollector._32_1_ = 0;
  segmentReferrerCollector._33_7_ = 0;
  segmentReferrerCollector._40_1_ = 0;
  segmentReferrerCollector._41_2_ = 0;
  segmentReferrerCollector._43_1_ = 0;
  segmentReferrerCollector._44_4_ = 0;
  puVar50 = (this->primary->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar30 = (this->primary->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar50 != puVar30) {
    do {
      pEVar53 = (puVar50->_M_t).
                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if ((pEVar53->kind != Function) &&
         (*(__index_type *)
           ((long)&(pEVar53->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0')
         ) {
        segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                    CONCAT44(segment_1._4_4_,
                             ((puVar50->_M_t).
                              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                              .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind);
        segmentReferrers._M_h._M_buckets =
             *(__buckets_ptr *)
              &(pEVar53->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
               super__Move_assign_alias<wasm::Name,_wasm::HeapType>;
        segmentReferrers._M_h._M_bucket_count =
             *(size_type *)
              ((long)&(pEVar53->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8);
        pmVar74 = std::__detail::
                  _Map_base<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)auStack_278,(key_type *)&segment_1);
        pcVar87 = *(char **)((long)&(pEVar53->name).super_IString + 8);
        (pmVar74->super_IString).str._M_len = *(size_t *)&(pEVar53->name).super_IString;
        (pmVar74->super_IString).str._M_str = pcVar87;
      }
      puVar50 = puVar50 + 1;
    } while (puVar50 != puVar30);
  }
  builder_1.wasm = (Module *)auStack_278;
  puVar103 = (this->primary->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  puVar31 = (this->primary->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  auStack_b8 = (undefined1  [8])this;
  if (puVar103 != puVar31) {
    psVar2 = &segmentReferrers._M_h._M_bucket_count;
    do {
      secondaryItem =
           wasm::ModuleUtils::copyMemory
                     ((puVar103->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,this->secondary);
      segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x6;
      segmentReferrers._M_h._M_bucket_count =
           CONCAT17(segmentReferrers._M_h._M_bucket_count._7_1_,0x79726f6d656d);
      segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                  psVar2;
      shareImportableItems::anon_class_16_2_802485ec::operator()
                ((anon_class_16_2_802485ec *)auStack_b8,
                 &((puVar103->_M_t).
                   super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->super_Importable,
                 &secondaryItem->super_Importable,(string *)&segment_1,Memory);
      if (segment_1 !=
          (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)psVar2) {
        operator_delete(segment_1,segmentReferrers._M_h._M_bucket_count + 1);
      }
      puVar103 = puVar103 + 1;
    } while (puVar103 != puVar31);
  }
  puVar104 = (this->primary->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  puVar32 = (this->primary->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar104 != puVar32) {
    psVar2 = &segmentReferrers._M_h._M_bucket_count;
    do {
      pTVar75 = Module::getTableOrNull
                          (this->secondary,
                           (IString)*(IString *)
                                     &(((puVar104->_M_t).
                                        super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                        .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                                      super_Importable).super_Named);
      if (pTVar75 == (Table *)0x0) {
        pTVar75 = wasm::ModuleUtils::copyTable
                            ((puVar104->_M_t).
                             super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                             .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl,
                             this->secondary);
      }
      segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x5;
      segmentReferrers._M_h._M_bucket_count =
           CONCAT26(segmentReferrers._M_h._M_bucket_count._6_2_,0x656c626174);
      segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                  psVar2;
      shareImportableItems::anon_class_16_2_802485ec::operator()
                ((anon_class_16_2_802485ec *)auStack_b8,
                 &((puVar104->_M_t).
                   super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->super_Importable,
                 &pTVar75->super_Importable,(string *)&segment_1,Table);
      if (segment_1 !=
          (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)psVar2) {
        operator_delete(segment_1,segmentReferrers._M_h._M_bucket_count + 1);
      }
      puVar104 = puVar104 + 1;
    } while (puVar104 != puVar32);
  }
  puVar90 = (this->primary->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar24 = (this->primary->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar90 != puVar24) {
    psVar2 = &segmentReferrers._M_h._M_bucket_count;
    do {
      if ((((puVar90->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->mutable_ == true) &&
         (((this->primary->features).features & 2) == 0)) {
        __assert_fail("primary.features.hasMutableGlobals() && \"TODO: add wrapper functions for disallowed mutable globals\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                      ,0x369,
                      "void wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::shareImportableItems()"
                     );
      }
      auStack_e8 = (undefined1  [8])operator_new(0x50);
      (((Table *)auStack_e8)->max).addr = 0;
      (((Table *)auStack_e8)->addressType).id = 0;
      (((Table *)auStack_e8)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      (((Table *)auStack_e8)->initial).addr = 0;
      *(undefined8 *)&(((Table *)auStack_e8)->super_Importable).module.super_IString.str._M_str = 0;
      (((Table *)auStack_e8)->super_Importable).base.super_IString.str._M_len = 0;
      ((__node_base *)&(((Table *)auStack_e8)->super_Importable).super_Named.hasExplicitName)->
      _M_nxt = (_Hash_node_base *)0x0;
      (((Table *)auStack_e8)->super_Importable).module.super_IString.str._M_len = 0;
      (((Table *)auStack_e8)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
      (((Table *)auStack_e8)->super_Importable).super_Named.name.super_IString.str._M_str =
           (char *)0x0;
      pGVar25 = (puVar90->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      (((Table *)auStack_e8)->initial).addr = (pGVar25->type).id;
      *(bool *)&(((Table *)auStack_e8)->addressType).id = pGVar25->mutable_;
      if (pGVar25->init == (Expression *)0x0) {
        pEVar76 = (Expression *)0x0;
      }
      else {
        segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                    0x0;
        segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x0;
        segmentReferrers._M_h._M_before_begin._M_nxt =
             (_Hash_node_base *)
             std::
             _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
             ::_M_invoke;
        segmentReferrers._M_h._M_bucket_count =
             (size_type)
             std::
             _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
             ::_M_manager;
        pEVar76 = ExpressionManipulator::flexibleCopy
                            (pGVar25->init,this->secondary,(CustomCopier *)&segment_1);
        if (segmentReferrers._M_h._M_bucket_count != 0) {
          (*(code *)segmentReferrers._M_h._M_bucket_count)
                    ((string *)&segment_1,(string *)&segment_1,3);
        }
      }
      ((Address *)((long)auStack_e8 + 0x40))->addr = (address64_t)pEVar76;
      segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x6;
      segmentReferrers._M_h._M_bucket_count =
           CONCAT17(segmentReferrers._M_h._M_bucket_count._7_1_,0x6c61626f6c67);
      segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                  psVar2;
      shareImportableItems::anon_class_16_2_802485ec::operator()
                ((anon_class_16_2_802485ec *)auStack_b8,
                 &((puVar90->_M_t).
                   super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->super_Importable,
                 (Importable *)auStack_e8,(string *)&segment_1,Global);
      if (segment_1 !=
          (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)psVar2) {
        operator_delete(segment_1,segmentReferrers._M_h._M_bucket_count + 1);
      }
      Module::addGlobal(this->secondary,
                        (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)auStack_e8);
      if (auStack_e8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_e8,0x50);
      }
      puVar90 = puVar90 + 1;
    } while (puVar90 != puVar24);
  }
  puVar94 = (this->primary->tags).
            super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar33 = (this->primary->tags).
            super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar94 != puVar33) {
    psVar2 = &segmentReferrers._M_h._M_bucket_count;
    do {
      auStack_e8 = (undefined1  [8])operator_new(0x40);
      (((Table *)auStack_e8)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      (((Table *)auStack_e8)->initial).addr = 0;
      *(undefined8 *)&(((Table *)auStack_e8)->super_Importable).module.super_IString.str._M_str = 0;
      (((Table *)auStack_e8)->super_Importable).base.super_IString.str._M_len = 0;
      ((__node_base *)&(((Table *)auStack_e8)->super_Importable).super_Named.hasExplicitName)->
      _M_nxt = (_Hash_node_base *)0x0;
      (((Table *)auStack_e8)->super_Importable).module.super_IString.str._M_len = 0;
      (((Table *)auStack_e8)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
      (((Table *)auStack_e8)->super_Importable).super_Named.name.super_IString.str._M_str =
           (char *)0x0;
      (((Table *)auStack_e8)->initial).addr = 0x10;
      primaryItem = (puVar94->_M_t).
                    super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                    super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      (((Table *)auStack_e8)->initial).addr = (primaryItem->type).id;
      segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x3;
      segmentReferrers._M_h._M_bucket_count =
           CONCAT44(segmentReferrers._M_h._M_bucket_count._4_4_,0x676174);
      segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                  psVar2;
      shareImportableItems::anon_class_16_2_802485ec::operator()
                ((anon_class_16_2_802485ec *)auStack_b8,&primaryItem->super_Importable,
                 (Importable *)auStack_e8,(string *)&segment_1,Tag);
      if (segment_1 !=
          (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)psVar2) {
        operator_delete(segment_1,segmentReferrers._M_h._M_bucket_count + 1);
      }
      Module::addTag(this->secondary,
                     (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)auStack_e8);
      if (auStack_e8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_e8,0x40);
      }
      puVar94 = puVar94 + 1;
    } while (puVar94 != puVar33);
  }
  std::
  _Hashtable<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)auStack_278);
  pMVar48 = this->secondary;
  auStack_278._0_4_ = 0x1091270;
  auStack_278._4_4_ = 0;
  segmentReferrerCollector.wasm._0_4_ = SUB84(pMVar48,0);
  segmentReferrerCollector.wasm._4_4_ = (undefined4)((ulong)pMVar48 >> 0x20);
  segmentReferrerCollector._16_8_ = 0;
  segmentReferrerCollector._8_8_ = &pMVar48->allocator;
  segmentReferrerCollector._24_4_ = 0;
  segmentReferrerCollector._28_4_ = 0;
  segmentReferrerCollector._32_1_ = 0;
  segmentReferrerCollector._33_7_ = 0;
  segmentReferrerCollector._40_1_ = 0;
  segmentReferrerCollector._41_2_ = 0x101;
  segmentReferrerCollector._44_4_ = 0;
  segmentReferrerCollector._48_4_ = 0;
  segmentReferrerCollector._52_4_ = 2;
  IStack_238 = 0xffffffff;
  auStack_198._0_8_ = (pointer)0x0;
  auStack_198._8_8_ = auStack_198._8_8_ & 0xffffffffffff0000;
  segment_1 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)0x1d;
  auStack_b8 = (undefined1  [8])local_a8;
  auStack_b8 = (undefined1  [8])
               std::__cxx11::string::_M_create((ulong *)auStack_b8,(ulong)&segment_1);
  local_a8._0_8_ = segment_1;
  *(undefined8 *)((long)auStack_b8 + 0xd) = 0x2d656c75646f6d2d;
  *(undefined8 *)((long)auStack_b8 + 0x15) = 0x73746e656d656c65;
  *(undefined8 *)auStack_b8 = 0x752d65766f6d6572;
  *(undefined8 *)((long)auStack_b8 + 8) = 0x6f6d2d646573756e;
  builder_1.wasm = (Module *)segment_1;
  *(char *)((long)auStack_b8 + (long)segment_1) = '\0';
  segmentReferrers._M_h._M_element_count =
       segmentReferrers._M_h._M_element_count & 0xffffffffffffff00;
  PassRunner::add((PassRunner *)auStack_278,(string *)auStack_b8,
                  (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&segment_1);
  if (((char)segmentReferrers._M_h._M_element_count == '\x01') &&
     (segmentReferrers._M_h._M_element_count =
           segmentReferrers._M_h._M_element_count & 0xffffffffffffff00,
     segment_1 !=
     (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
     &segmentReferrers._M_h._M_bucket_count)) {
    operator_delete(segment_1,segmentReferrers._M_h._M_bucket_count + 1);
  }
  if (auStack_b8 != (undefined1  [8])local_a8) {
    operator_delete((void *)auStack_b8,(ulong)(local_a8._0_8_ + 1));
  }
  PassRunner::run((PassRunner *)auStack_278);
  PassRunner::~PassRunner((PassRunner *)auStack_278);
  return;
}

Assistant:

ModuleSplitter(Module& primary, const Config& config)
    : config(config), secondaryPtr(initSecondary(primary)), primary(primary),
      secondary(*secondaryPtr),
      classifiedFuncs(classifyFunctions(primary, config)),
      primaryFuncs(classifiedFuncs.first),
      secondaryFuncs(classifiedFuncs.second), tableManager(primary),
      exportedPrimaryFuncs(initExportedPrimaryFuncs(primary)) {
    if (config.jspi) {
      setupJSPI();
    }
    moveSecondaryFunctions();
    thunkExportedSecondaryFunctions();
    indirectReferencesToSecondaryFunctions();
    indirectCallsToSecondaryFunctions();
    exportImportCalledPrimaryFunctions();
    setupTablePatching();
    shareImportableItems();
    removeUnusedSecondaryElements();
  }